

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qloggingregistry.cpp
# Opt level: O2

void __thiscall
QLoggingRegistry::registerCategory
          (QLoggingRegistry *this,QLoggingCategory *cat,QtMsgType enableForLevel)

{
  long in_FS_OFFSET;
  QtMsgType local_44;
  QLoggingCategory *local_40;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_44 = enableForLevel;
  local_40 = cat;
  QBasicMutex::lock((QBasicMutex *)this);
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHash<QLoggingCategory*,QtMsgType>::tryEmplace_impl<QLoggingCategory*const&,QtMsgType&>
            ((TryEmplaceResult *)local_38,(QHash<QLoggingCategory*,QtMsgType> *)&this->categories,
             &local_40,&local_44);
  if (local_38[0x10] == true) {
    (*this->categoryFilter)(local_40);
  }
  QBasicMutex::unlock((QBasicMutex *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLoggingRegistry::registerCategory(QLoggingCategory *cat, QtMsgType enableForLevel)
{
    const auto locker = qt_scoped_lock(registryMutex);

    auto r = categories.tryEmplace(cat, enableForLevel);
    if (r.inserted) {
        // new entry
        (*categoryFilter)(cat);
    }
}